

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# profile.hpp
# Opt level: O0

void __thiscall
ruckig::Profile::set_boundary
          (Profile *this,double p0_new,double v0_new,double a0_new,double pf_new,double vf_new,
          double af_new)

{
  reference pvVar1;
  double af_new_local;
  double vf_new_local;
  double pf_new_local;
  double a0_new_local;
  double v0_new_local;
  double p0_new_local;
  Profile *this_local;
  
  pvVar1 = std::array<double,_8UL>::operator[](&this->a,0);
  *pvVar1 = a0_new;
  pvVar1 = std::array<double,_8UL>::operator[](&this->v,0);
  *pvVar1 = v0_new;
  pvVar1 = std::array<double,_8UL>::operator[](&this->p,0);
  *pvVar1 = p0_new;
  this->af = af_new;
  this->vf = vf_new;
  this->pf = pf_new;
  return;
}

Assistant:

inline void set_boundary(double p0_new, double v0_new, double a0_new, double pf_new, double vf_new, double af_new) {
        a[0] = a0_new;
        v[0] = v0_new;
        p[0] = p0_new;
        af = af_new;
        vf = vf_new;
        pf = pf_new;
    }